

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O3

void __thiscall
FStringTable::FindString(FStringTable *this,char *name,StringEntry ***pentry1,StringEntry **entry1)

{
  uint uVar1;
  int iVar2;
  StringEntry *pSVar3;
  StringEntry *pSVar4;
  
  uVar1 = MakeKey(name);
  pSVar4 = (StringEntry *)(this->Buckets + (uVar1 & 0x7f));
  while ((pSVar3 = pSVar4, pSVar4 = pSVar3->Next, pSVar4 != (StringEntry *)0x0 &&
         (iVar2 = strcasecmp(pSVar4->Name,name), iVar2 != 1))) {
    if (iVar2 == 0) {
LAB_005a1022:
      *pentry1 = &pSVar3->Next;
      *entry1 = pSVar4;
      return;
    }
  }
  pSVar4 = (StringEntry *)0x0;
  goto LAB_005a1022;
}

Assistant:

void FStringTable::FindString (const char *name, StringEntry **&pentry1, StringEntry *&entry1)
{
	DWORD bucket = MakeKey (name) & (HASH_SIZE - 1);
	StringEntry **pentry = &Buckets[bucket], *entry = *pentry;

	while (entry != NULL)
	{
		int cmpval = stricmp (entry->Name, name);
		if (cmpval == 0)
		{
			pentry1 = pentry;
			entry1 = entry;
			return;
		}
		if (cmpval == 1)
		{
			pentry1 = pentry;
			entry1 = NULL;
			return;
		}
		pentry = &entry->Next;
		entry = *pentry;
	}
	pentry1 = pentry;
	entry1 = entry;
}